

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O0

void finish(sender *s)

{
  long *in_RDI;
  v_array<int> *in_stack_fffffffffffffff0;
  
  v_array<int>::delete_v(in_stack_fffffffffffffff0);
  v_array<char>::delete_v((v_array<char> *)in_stack_fffffffffffffff0);
  free((void *)in_RDI[3]);
  if ((long *)*in_RDI != (long *)0x0) {
    (**(code **)(*(long *)*in_RDI + 0x18))();
  }
  return;
}

Assistant:

void finish(sender& s)
{
  s.buf->files.delete_v();
  s.buf->space.delete_v();
  free(s.delay_ring);
  delete s.buf;
}